

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NvmlLib.cpp
# Opt level: O0

bool xmrig::NvmlLib::assign(vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *devices)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  iterator __lhs;
  PciTopology *pPVar4;
  undefined8 in_RDI;
  CudaDevice *device;
  iterator __end2;
  iterator __begin2;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *__range2;
  nvmlPciInfo_t pci;
  nvmlDevice_t nvmlDevice;
  uint32_t i;
  uint32_t count;
  reference in_stack_ffffffffffffff78;
  __normal_iterator<xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
  local_78;
  undefined8 local_70;
  nvmlPciInfo_t local_64;
  nvmlDevice_t local_20;
  uint local_18;
  uint local_14;
  undefined8 local_10;
  bool local_1;
  
  local_14 = 0;
  local_10 = in_RDI;
  iVar3 = (*pNvmlDeviceGetCount)(&local_14);
  if (iVar3 == 0) {
    for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
      iVar3 = (*pNvmlDeviceGetHandleByIndex)(local_18,&local_20);
      if (iVar3 == 0) {
        nvmlPciInfo_t::nvmlPciInfo_t(&local_64);
        iVar3 = (*pNvmlDeviceGetPciInfo)(local_20,&local_64);
        if (iVar3 == 0) {
          local_70 = local_10;
          local_78._M_current =
               (CudaDevice *)
               std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::begin
                         ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)
                          in_stack_ffffffffffffff78);
          __lhs = std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::end
                            ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)
                             in_stack_ffffffffffffff78);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
                                     *)__lhs._M_current,
                                    (__normal_iterator<xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
                                     *)in_stack_ffffffffffffff78), bVar1) {
            in_stack_ffffffffffffff78 =
                 __gnu_cxx::
                 __normal_iterator<xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
                 ::operator*(&local_78);
            pPVar4 = CudaDevice::topology(in_stack_ffffffffffffff78);
            bVar2 = PciTopology::bus(pPVar4);
            if (bVar2 == local_64.bus) {
              pPVar4 = CudaDevice::topology(in_stack_ffffffffffffff78);
              bVar2 = PciTopology::device(pPVar4);
              if (bVar2 == local_64.device) {
                CudaDevice::setNvmlDevice(in_stack_ffffffffffffff78,local_20);
              }
            }
            __gnu_cxx::
            __normal_iterator<xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
            ::operator++(&local_78);
          }
        }
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool xmrig::NvmlLib::assign(std::vector<CudaDevice> &devices)
{
    uint32_t count = 0;
    if (pNvmlDeviceGetCount(&count) != NVML_SUCCESS) {
        return false;
    }

    for (uint32_t i = 0; i < count; i++) {
        nvmlDevice_t nvmlDevice;
        if (pNvmlDeviceGetHandleByIndex(i, &nvmlDevice) != NVML_SUCCESS) {
            continue;
        }

        nvmlPciInfo_t pci;
        if (pNvmlDeviceGetPciInfo(nvmlDevice, &pci) != NVML_SUCCESS) {
            continue;
        }

        for (auto &device : devices) {
            if (device.topology().bus() == pci.bus && device.topology().device() == pci.device) {
                device.setNvmlDevice(nvmlDevice);
            }
        }
    }

    return true;
}